

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_YAFluxRegister.cpp
# Opt level: O2

void __thiscall
amrex::YAFluxRegister::YAFluxRegister
          (YAFluxRegister *this,BoxArray *fba,BoxArray *cba,DistributionMapping *fdm,
          DistributionMapping *cdm,Geometry *fgeom,Geometry *cgeom,IntVect *ref_ratio,int fine_lev,
          int nvar)

{
  MultiFab::MultiFab(&this->m_crse_data);
  iMultiFab::iMultiFab(&this->m_crse_flag);
  (this->m_crse_fab_flag).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->m_crse_fab_flag).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->m_crse_fab_flag).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  MultiFab::MultiFab(&this->m_cfpatch);
  MultiFab::MultiFab(&this->m_cfp_mask);
  (this->m_cfp_localindex).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->m_cfp_localindex).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  (this->m_cfp_fab).
  super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  .
  super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cfp_localindex).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->m_cfp_fab).
  super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  .
  super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cfp_fab).
  super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  .
  super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Geometry::Geometry(&this->m_fine_geom);
  Geometry::Geometry(&this->m_crse_geom);
  (this->m_ratio).vect[0] = 0;
  (this->m_ratio).vect[1] = 0;
  (this->m_ratio).vect[2] = 0;
  define(this,fba,cba,fdm,cdm,fgeom,cgeom,ref_ratio,fine_lev,nvar);
  return;
}

Assistant:

YAFluxRegister::YAFluxRegister (const BoxArray& fba, const BoxArray& cba,
                                const DistributionMapping& fdm, const DistributionMapping& cdm,
                                const Geometry& fgeom, const Geometry& cgeom,
                                const IntVect& ref_ratio, int fine_lev, int nvar)
{
    define(fba, cba, fdm, cdm, fgeom, cgeom, ref_ratio, fine_lev, nvar);
}